

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

Builder * __thiscall
capnp::_::ListBuilder::asText(Builder *__return_storage_ptr__,ListBuilder *this)

{
  ulong uVar1;
  int line;
  char *condition;
  Fault f;
  Fault local_18;
  
  if ((this->structDataSize == 8) && (this->structPointerCount == 0)) {
    uVar1 = (ulong)this->elementCount;
    if (uVar1 == 0) {
      condition = "size > 0";
      line = 0xbc9;
    }
    else {
      if (this->ptr[uVar1 - 1] == '\0') {
        (__return_storage_ptr__->content).ptr = (char *)this->ptr;
        (__return_storage_ptr__->content).size_ = uVar1;
        return __return_storage_ptr__;
      }
      condition = "cptr[size] == \'\\0\'";
      line = 0xbd0;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[50]>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,line,FAILED,condition,"\"Message contains text that is not NUL-terminated.\"",
               (char (*) [50])"Message contains text that is not NUL-terminated.");
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0xbc3,FAILED,
               "structDataSize == G(8) * BITS && structPointerCount == ZERO * POINTERS",
               "\"Expected Text, got list of non-bytes.\"",
               (char (*) [38])"Expected Text, got list of non-bytes.");
  }
  (__return_storage_ptr__->content).ptr = &Text::Builder::nulstr;
  (__return_storage_ptr__->content).size_ = 1;
  kj::_::Debug::Fault::~Fault(&local_18);
  return __return_storage_ptr__;
}

Assistant:

Text::Builder ListBuilder::asText() {
  KJ_REQUIRE(structDataSize == G(8) * BITS && structPointerCount == ZERO * POINTERS,
             "Expected Text, got list of non-bytes.") {
    return Text::Builder();
  }

  size_t size = unbound(elementCount / ELEMENTS);

  KJ_REQUIRE(size > 0, "Message contains text that is not NUL-terminated.") {
    return Text::Builder();
  }

  char* cptr = reinterpret_cast<char*>(ptr);
  --size;  // NUL terminator

  KJ_REQUIRE(cptr[size] == '\0', "Message contains text that is not NUL-terminated.") {
    return Text::Builder();
  }

  return Text::Builder(cptr, size);
}